

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

MAP_RESULT Map_Add(MAP_HANDLE handle,char *key,char *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char **ppcVar3;
  MAP_RESULT MVar4;
  char *pcVar5;
  undefined8 uVar6;
  
  if ((key == (char *)0x0 || handle == (MAP_HANDLE)0x0) || value == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    MVar4 = MAP_INVALIDARG;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return MAP_INVALIDARG;
    }
    iVar1 = 0x161;
    uVar6 = 3;
    pcVar5 = MAP_RESULTStringStorage[3];
  }
  else {
    ppcVar3 = findKey(handle,key);
    if (ppcVar3 != (char **)0x0) {
      return MAP_KEYEXISTS;
    }
    if ((handle->mapFilterCallback != (MAP_FILTER_CALLBACK)0x0) &&
       (iVar1 = (*handle->mapFilterCallback)(key,value), iVar1 != 0)) {
      return MAP_FILTER_REJECT;
    }
    iVar1 = insertNewKeyValue(handle,key,value);
    if (iVar1 == 0) {
      return MAP_OK;
    }
    p_Var2 = xlogging_get_log_function();
    MVar4 = MAP_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return MAP_ERROR;
    }
    iVar1 = 0x179;
    uVar6 = 2;
    pcVar5 = MAP_RESULTStringStorage[2];
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/map.c"
            ,"Map_Add",iVar1,1,"result = %s%s (%d)","",pcVar5,uVar6);
  return MVar4;
}

Assistant:

MAP_RESULT Map_Add(MAP_HANDLE handle, const char* key, const char* value)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_006: [If parameter handle is NULL then Map_Add shall return MAP_INVALID_ARG.] */
    /*Codes_SRS_MAP_02_007: [If parameter key is NULL then Map_Add shall return MAP_INVALID_ARG.]*/
    /*Codes_SRS_MAP_02_008: [If parameter value is NULL then Map_Add shall return MAP_INVALID_ARG.] */
    if (
        (handle == NULL) ||
        (key == NULL) ||
        (value == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        /*Codes_SRS_MAP_02_009: [If the key already exists, then Map_Add shall return MAP_KEYEXISTS.] */
        if (findKey(handleData, key) != NULL)
        {
            result = MAP_KEYEXISTS;
        }
        else
        {
            /* Codes_SRS_MAP_07_009: [If the mapFilterCallback function is not NULL, then the return value will be check and if it is not zero then Map_Add shall return MAP_FILTER_REJECT.] */
            if ( (handleData->mapFilterCallback != NULL) && (handleData->mapFilterCallback(key, value) != 0) )
            {
                result = MAP_FILTER_REJECT;
            }
            else
            {
                /*Codes_SRS_MAP_02_010: [Otherwise, Map_Add shall add the pair <key,value> to the map.] */
                if (insertNewKeyValue(handleData, key, value) != 0)
                {
                    /*Codes_SRS_MAP_02_011: [If adding the pair <key,value> fails then Map_Add shall return MAP_ERROR.] */
                    result = MAP_ERROR;
                    LOG_MAP_ERROR;
                }
                else
                {
                    /*Codes_SRS_MAP_02_012: [Otherwise, Map_Add shall return MAP_OK.] */
                    result = MAP_OK;
                }
            }
        }
    }
    return result;
}